

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

int gcd(int64_t a,int b)

{
  long lVar1;
  int remainder;
  int b_local;
  int64_t a_local;
  
  b_local = b;
  a_local = a;
  while (0 < b_local) {
    lVar1 = a_local % (long)b_local;
    a_local = (int64_t)b_local;
    b_local = (int)lVar1;
  }
  return (int)a_local;
}

Assistant:

static inline int gcd(int64_t a, int b) {
  int remainder;
  while (b > 0) {
    remainder = (int)(a % b);
    a = b;
    b = remainder;
  }

  return (int)a;
}